

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

int GetWordVector(void *hPtr,char *input,float **vector)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *__dest;
  int64_t iVar3;
  size_t __n;
  real *__src;
  undefined8 *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  size_t sz;
  float *vec;
  exception *e;
  string wordStr;
  Vector svec;
  FastTextWrapper *fastText;
  int64_t in_stack_fffffffffffffef8;
  Vector *in_stack_ffffffffffffff00;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff50;
  Vector *in_stack_ffffffffffffff58;
  void *pvVar4;
  FastText *in_stack_ffffffffffffff60;
  allocator<char> local_59;
  string local_58 [56];
  undefined8 *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  fasttext::FastText::getDimension((FastText *)0x1f365c);
  fasttext::Vector::Vector(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_18,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<char>::~allocator(&local_59);
  fasttext::FastText::getWordVector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  uVar2 = fasttext::Vector::size((Vector *)0x1f3876);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __dest = operator_new__(uVar2);
  iVar3 = fasttext::Vector::size((Vector *)0x1f38bb);
  __n = iVar3 << 2;
  pvVar4 = __dest;
  __src = fasttext::Vector::data((Vector *)0x1f38e7);
  memcpy(__dest,__src,__n);
  *local_20 = pvVar4;
  iVar3 = fasttext::Vector::size((Vector *)0x1f391f);
  local_4 = (int)iVar3;
  std::__cxx11::string::~string(local_58);
  fasttext::Vector::~Vector((Vector *)0x1f3955);
  return local_4;
}

Assistant:

GetWordVector(void* hPtr, const char* input, float** vector)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    Vector svec(fastText->getDimension());
    std::string wordStr(input);

    try {
        fastText->getWordVector(svec, wordStr);
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    auto vec = new float[svec.size()];
    size_t sz = sizeof(float)*svec.size();
    memcpy(vec, svec.data(), sz);

    *vector = vec;

    return (int) svec.size();
}